

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

char * lua_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x228,
                  "const char *lua_pushvfstring(lua_State *, const char *, struct __va_list_tag *)")
    ;
  }
  pcVar3 = luaO_pushvfstring(L,fmt,argp);
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  piVar2 = *(int **)&L[-1].hookmask;
  *piVar2 = *piVar2 + -1;
  if (*piVar2 == 0) {
    return pcVar3;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x22b,
                "const char *lua_pushvfstring(lua_State *, const char *, struct __va_list_tag *)");
}

Assistant:

LUA_API const char *lua_pushvfstring (lua_State *L, const char *fmt,
                                      va_list argp) {
  const char *ret;
  lua_lock(L);
  ret = luaO_pushvfstring(L, fmt, argp);
  luaC_checkGC(L);
  lua_unlock(L);
  return ret;
}